

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall olc::PixelGameEngine::olc_CoreUpdate(PixelGameEngine *this)

{
  uint uVar1;
  pointer ppPVar2;
  pointer pDVar3;
  uint __val;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  bool *pbVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  DecalInstance *decal;
  pointer __pos;
  PGEX **ext_1;
  pointer ppPVar14;
  pointer pLVar15;
  pointer pLVar16;
  uint __len;
  PGEX **ext;
  float fVar17;
  float fElapsedTime;
  string sTitle;
  string __str;
  float local_b8;
  float local_b4;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar7 = std::chrono::_V2::system_clock::now();
  (this->m_tp2).__d.__r = lVar7;
  local_b8 = (float)(lVar7 - (this->m_tp1).__d.__r) / 1e+09;
  (this->m_tp1).__d.__r = lVar7;
  this->fLastElapsed = local_b8;
  local_b4 = local_b8;
  (**(code **)(*platform + 0x50))();
  pbVar8 = this->pKeyOldState;
  lVar7 = 0x33a;
  do {
    *(undefined2 *)((long)this + lVar7 + -2) = 0;
    if (pbVar8[-0x100] != *pbVar8) {
      if (pbVar8[-0x100] == false) {
        *(undefined2 *)((long)this + lVar7 + -1) = 1;
      }
      else {
        *(byte *)((long)this + lVar7 + -2) =
             *(byte *)((long)&this->_vptr_PixelGameEngine + lVar7) ^ 1;
        *(undefined1 *)((long)&this->_vptr_PixelGameEngine + lVar7) = 1;
      }
    }
    *pbVar8 = pbVar8[-0x100];
    lVar7 = lVar7 + 3;
    pbVar8 = pbVar8 + 1;
  } while (lVar7 != 0x63a);
  pbVar8 = this->pMouseNewState;
  lVar7 = 0x644;
  do {
    *(undefined2 *)((long)this + lVar7 + -2) = 0;
    if (*pbVar8 != pbVar8[5]) {
      if (*pbVar8 == false) {
        *(undefined2 *)((long)this + lVar7 + -1) = 1;
      }
      else {
        *(byte *)((long)this + lVar7 + -2) =
             *(byte *)((long)&this->_vptr_PixelGameEngine + lVar7) ^ 1;
        *(undefined1 *)((long)&this->_vptr_PixelGameEngine + lVar7) = 1;
      }
    }
    pbVar8[5] = *pbVar8;
    lVar7 = lVar7 + 3;
    pbVar8 = pbVar8 + 1;
  } while (lVar7 != 0x653);
  this->vMousePos = this->vMousePosCache;
  this->nMouseWheelDelta = this->nMouseWheelDeltaCache;
  this->nMouseWheelDeltaCache = 0;
  ppPVar2 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  fVar17 = local_b4;
  for (ppPVar14 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppPVar14 != ppPVar2;
      ppPVar14 = ppPVar14 + 1) {
    (*(*ppPVar14)->_vptr_PGEX[2])(*ppPVar14,&local_b8);
    fVar17 = local_b8;
  }
  iVar5 = (*this->_vptr_PixelGameEngine[3])(fVar17,this);
  if ((char)iVar5 == '\0') {
    LOCK();
    bAtomActive = 0;
    UNLOCK();
  }
  ppPVar2 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar14 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppPVar14 != ppPVar2;
      ppPVar14 = ppPVar14 + 1) {
    (*(*ppPVar14)->_vptr_PGEX[3])(local_b8);
  }
  (**(code **)(*renderer + 0x78))(renderer,&this->vViewPos,&this->vViewSize);
  (**(code **)(*renderer + 0x80))(renderer,BLACK,1);
  pLVar16 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pLVar16->bShow = true;
  pLVar16->bUpdate = true;
  this->nDecalMode = NORMAL;
  (**(code **)(*renderer + 0x30))();
  pLVar16 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while (pLVar15 = pLVar16,
        pLVar15 !=
        (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>._M_impl.
        super__Vector_impl_data._M_start) {
    pLVar16 = pLVar15 + -1;
    if (pLVar15[-1].bShow == true) {
      if (pLVar15[-1].funcHook.super__Function_base._M_manager == (_Manager_type)0x0) {
        (**(code **)(*renderer + 0x70))(renderer,pLVar15[-1].nResID);
        if (pLVar15[-1].bUpdate == true) {
          (**(code **)(*renderer + 0x58))(renderer,pLVar15[-1].nResID,pLVar15[-1].pDrawTarget);
          pLVar15[-1].bUpdate = false;
        }
        (**(code **)(*renderer + 0x40))
                  (renderer,pLVar16,&pLVar15[-1].vScale,pLVar15[-1].tint.field_0.n);
        __pos = pLVar15[-1].vecDecalInstance.
                super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>._M_impl.
                super__Vector_impl_data._M_start;
        pDVar3 = pLVar15[-1].vecDecalInstance.
                 super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (__pos != pDVar3) {
          do {
            (**(code **)(*renderer + 0x48))(renderer,__pos);
            __pos = __pos + 1;
          } while (__pos != pDVar3);
          __pos = pLVar15[-1].vecDecalInstance.
                  super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::_M_erase_at_end
                  (&pLVar15[-1].vecDecalInstance,__pos);
      }
      else {
        (*pLVar15[-1].funcHook._M_invoker)((_Any_data *)&pLVar15[-1].funcHook);
      }
    }
  }
  (**(code **)(*renderer + 0x28))();
  fVar17 = local_b8 + this->fFrameTimer;
  this->fFrameTimer = fVar17;
  uVar6 = this->nFrameCount + 1;
  this->nFrameCount = uVar6;
  if (fVar17 < 1.0) {
    return;
  }
  this->nLastFPS = uVar6;
  this->fFrameTimer = fVar17 + -1.0;
  std::operator+(&local_50,"OneLoneCoder.com - Pixel Game Engine - ",&this->sAppName);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_80 = *puVar12;
    lStack_78 = plVar9[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar12;
    local_90 = (ulong *)*plVar9;
  }
  local_88 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar1 = this->nFrameCount;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar13 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar11 = (uint)uVar13;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00117b8b;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00117b8b;
      }
      if (uVar11 < 10000) goto LAB_00117b8b;
      uVar13 = uVar13 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_00117b8b:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_70),__len,__val);
  uVar13 = 0xf;
  if (local_90 != &local_80) {
    uVar13 = local_80;
  }
  if (uVar13 < (ulong)(local_68 + local_88)) {
    uVar13 = 0xf;
    if (local_70 != local_60) {
      uVar13 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar13) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_00117c17;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_00117c17:
  local_b0 = &local_a0;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_a0 = *plVar9;
    uStack_98 = puVar10[3];
  }
  else {
    local_a0 = *plVar9;
    local_b0 = (long *)*puVar10;
  }
  local_a8 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*platform + 0x40))(platform,&local_b0);
  this->nFrameCount = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  return;
}

Assistant:

void PixelGameEngine::olc_CoreUpdate()
	{
		// Handle Timing
		m_tp2 = std::chrono::system_clock::now();
		std::chrono::duration<float> elapsedTime = m_tp2 - m_tp1;
		m_tp1 = m_tp2;

		// Our time per frame coefficient
		float fElapsedTime = elapsedTime.count();
		fLastElapsed = fElapsedTime;

		// Some platforms will need to check for events
		platform->HandleSystemEvent();

		// Compare hardware input states from previous frame
		auto ScanHardware = [&](HWButton *pKeys, bool *pStateOld, bool *pStateNew, uint32_t nKeyCount) {
			for (uint32_t i = 0; i < nKeyCount; i++)
			{
				pKeys[i].bPressed = false;
				pKeys[i].bReleased = false;
				if (pStateNew[i] != pStateOld[i])
				{
					if (pStateNew[i])
					{
						pKeys[i].bPressed = !pKeys[i].bHeld;
						pKeys[i].bHeld = true;
					}
					else
					{
						pKeys[i].bReleased = true;
						pKeys[i].bHeld = false;
					}
				}
				pStateOld[i] = pStateNew[i];
			}
		};

		ScanHardware(pKeyboardState, pKeyOldState, pKeyNewState, 256);
		ScanHardware(pMouseState, pMouseOldState, pMouseNewState, nMouseButtons);

		// Cache mouse coordinates so they remain consistent during frame
		vMousePos = vMousePosCache;
		nMouseWheelDelta = nMouseWheelDeltaCache;
		nMouseWheelDeltaCache = 0;

		//	renderer->ClearBuffer(olc::BLACK, true);

		// Handle Frame Update
		for (auto &ext : vExtensions)
			ext->OnBeforeUserUpdate(fElapsedTime);
		if (!OnUserUpdate(fElapsedTime))
			bAtomActive = false;
		for (auto &ext : vExtensions)
			ext->OnAfterUserUpdate(fElapsedTime);

		// Display Frame
		renderer->UpdateViewport(vViewPos, vViewSize);
		renderer->ClearBuffer(olc::BLACK, true);

		// Layer 0 must always exist
		vLayers[0].bUpdate = true;
		vLayers[0].bShow = true;
		SetDecalMode(DecalMode::NORMAL);
		renderer->PrepareDrawing();

		for (auto layer = vLayers.rbegin(); layer != vLayers.rend(); ++layer)
		{
			if (layer->bShow)
			{
				if (layer->funcHook == nullptr)
				{
					renderer->ApplyTexture(layer->nResID);
					if (layer->bUpdate)
					{
						renderer->UpdateTexture(layer->nResID, layer->pDrawTarget);
						layer->bUpdate = false;
					}

					renderer->DrawLayerQuad(layer->vOffset, layer->vScale, layer->tint);

					// Display Decals in order for this layer
					for (auto &decal : layer->vecDecalInstance)
						renderer->DrawDecal(decal);
					layer->vecDecalInstance.clear();
				}
				else
				{
					// Mwa ha ha.... Have Fun!!!
					layer->funcHook();
				}
			}
		}

		// Present Graphics to screen
		renderer->DisplayFrame();

		// Update Title Bar
		fFrameTimer += fElapsedTime;
		nFrameCount++;
		if (fFrameTimer >= 1.0f)
		{
			nLastFPS = nFrameCount;
			fFrameTimer -= 1.0f;
			std::string sTitle = "OneLoneCoder.com - Pixel Game Engine - " + sAppName + " - FPS: " + std::to_string(nFrameCount);
			platform->SetWindowTitle(sTitle);
			nFrameCount = 0;
		}
	}